

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O1

void __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
::expand(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
         *this)

{
  uint uVar1;
  Binding *pBVar2;
  uint64_t uVar3;
  undefined4 uVar4;
  Binding *pBVar5;
  Binding *pBVar6;
  Binding *pBVar7;
  void **head;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = this->_capacity;
  pBVar2 = this->_data;
  uVar9 = 4;
  if (uVar1 != 0) {
    uVar9 = (ulong)(uVar1 * 2);
  }
  uVar8 = (uint)uVar9;
  this->_capacity = uVar8;
  if (uVar8 == 0) {
    pBVar5 = (Binding *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar8 < 3) {
    pBVar5 = (Binding *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar8 < 5) {
    pBVar5 = (Binding *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pBVar5 = (Binding *)::operator_new(uVar9 << 4,0x10);
  }
  this->_data = pBVar5;
  this->_data1 = pBVar5 + -1;
  uVar9 = (ulong)this->_size;
  if (uVar9 != 0) {
    pBVar5 = pBVar5 + uVar9;
    pBVar7 = pBVar2 + uVar9;
    do {
      pBVar6 = pBVar7 + -1;
      uVar4 = *(undefined4 *)&pBVar6->field_0x4;
      uVar3 = pBVar7[-1].term._content;
      pBVar5[-1].var = pBVar6->var;
      *(undefined4 *)&pBVar5[-1].field_0x4 = uVar4;
      pBVar5[-1].term._content = uVar3;
      pBVar5 = pBVar5 + -1;
      pBVar7 = pBVar6;
    } while (pBVar5 != this->_data);
  }
  if (pBVar2 != (Binding *)0x0) {
    if (uVar1 == 1) {
      *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pBVar2;
    }
    else if (uVar1 == 0) {
      *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pBVar2;
    }
    else if (uVar1 < 3) {
      *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pBVar2;
    }
    else if (uVar1 == 3) {
      *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pBVar2;
    }
    else {
      if (4 < uVar1) {
        operator_delete(pBVar2,0x10);
        return;
      }
      *(undefined8 *)pBVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pBVar2;
    }
  }
  return;
}

Assistant:

void expand()
  {
    ASS(_capacity==_size);

    unsigned oldCapacity=_capacity;
    T* oldData=_data;

    _capacity= _capacity ? _capacity*2 : 4;

    void* mem = ALLOC_KNOWN(_capacity*sizeof(T),"BinaryHeap::T");
    _data = static_cast<T*>(mem);
    _data1 = _data-1;

    if(_size) {
      T* otp = oldData+_size;
      T* ntp = _data+_size;
      do {
	::new (--ntp) T(*(--otp));
	//because oldCapacity==_size, we destroy all elements of oldData array here
	otp->~T();
      } while(ntp!=_data);
    }

    if(oldData) {
      DEALLOC_KNOWN(oldData,oldCapacity*sizeof(T),"BinaryHeap::T");
    }
  }